

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obu_util.c
# Opt level: O3

aom_codec_err_t read_obu_header(aom_read_bit_buffer *rb,int is_annexb,ObuHeader *header)

{
  int iVar1;
  aom_codec_err_t aVar2;
  long lVar3;
  
  aVar2 = AOM_CODEC_INVALID_PARAM;
  if (header != (ObuHeader *)0x0 && rb != (aom_read_bit_buffer *)0x0) {
    lVar3 = (long)rb->bit_buffer_end - (long)rb->bit_buffer;
    aVar2 = AOM_CODEC_CORRUPT_FRAME;
    if (0 < lVar3) {
      header->size = 1;
      iVar1 = aom_rb_read_bit(rb);
      if (iVar1 == 0) {
        iVar1 = aom_rb_read_literal(rb,4);
        header->type = (OBU_TYPE)iVar1;
        iVar1 = aom_rb_read_bit(rb);
        header->has_extension = iVar1;
        iVar1 = aom_rb_read_bit(rb);
        header->has_size_field = iVar1;
        if (is_annexb == 0 && iVar1 == 0) {
          aVar2 = AOM_CODEC_UNSUP_BITSTREAM;
        }
        else {
          aom_rb_read_bit(rb);
          if (header->has_extension == 0) {
            header->temporal_layer_id = 0;
            header->spatial_layer_id = 0;
          }
          else {
            if (lVar3 == 1) {
              return AOM_CODEC_CORRUPT_FRAME;
            }
            header->size = header->size + 1;
            iVar1 = aom_rb_read_literal(rb,3);
            header->temporal_layer_id = iVar1;
            iVar1 = aom_rb_read_literal(rb,2);
            header->spatial_layer_id = iVar1;
            aom_rb_read_literal(rb,3);
          }
          aVar2 = AOM_CODEC_OK;
        }
      }
    }
  }
  return aVar2;
}

Assistant:

static aom_codec_err_t read_obu_header(struct aom_read_bit_buffer *rb,
                                       int is_annexb, ObuHeader *header) {
  if (!rb || !header) return AOM_CODEC_INVALID_PARAM;

  const ptrdiff_t bit_buffer_byte_length = rb->bit_buffer_end - rb->bit_buffer;
  if (bit_buffer_byte_length < 1) return AOM_CODEC_CORRUPT_FRAME;

  header->size = 1;

  if (aom_rb_read_bit(rb) != 0) {
    // Forbidden bit. Must not be set.
    return AOM_CODEC_CORRUPT_FRAME;
  }

  header->type = (OBU_TYPE)aom_rb_read_literal(rb, 4);
  header->has_extension = aom_rb_read_bit(rb);
  header->has_size_field = aom_rb_read_bit(rb);

  if (!header->has_size_field && !is_annexb) {
    // section 5 obu streams must have obu_size field set.
    return AOM_CODEC_UNSUP_BITSTREAM;
  }

  // obu_reserved_1bit must be set to 0. The value is ignored by a decoder.
  aom_rb_read_bit(rb);

  if (header->has_extension) {
    if (bit_buffer_byte_length == 1) return AOM_CODEC_CORRUPT_FRAME;

    header->size += 1;
    header->temporal_layer_id = aom_rb_read_literal(rb, 3);
    header->spatial_layer_id = aom_rb_read_literal(rb, 2);
    // extension_header_reserved_3bits must be set to 0. The value is ignored by
    // a decoder.
    aom_rb_read_literal(rb, 3);
  } else {
    header->temporal_layer_id = 0;
    header->spatial_layer_id = 0;
  }

  return AOM_CODEC_OK;
}